

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O1

bool wasm::replaceChildWith(Expression *expr,Expression *with)

{
  Expression **ppEVar1;
  char cVar2;
  uint uVar3;
  Index IVar4;
  Expression ***pppEVar5;
  Index index;
  bool bVar6;
  bool bVar7;
  AbstractChildIterator<wasm::ChildIterator> local_98;
  FindAll<wasm::Pop> local_58;
  ulong local_40;
  Expression *local_38;
  
  local_38 = with;
  AbstractChildIterator<wasm::ChildIterator>::AbstractChildIterator(&local_98,expr);
  uVar3 = (int)((ulong)((long)local_98.children.flexible.
                              super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_98.children.flexible.
                             super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3) +
          (int)local_98.children.usedFixed;
  local_40 = (ulong)uVar3;
  bVar6 = uVar3 != 0;
  if (bVar6) {
    index = 0;
    do {
      IVar4 = AbstractChildIterator<wasm::ChildIterator>::mapIndex(&local_98,index);
      pppEVar5 = local_98.children.flexible.
                 super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                 _M_impl.super__Vector_impl_data._M_start + ((ulong)IVar4 - 4);
      if (IVar4 < 4) {
        pppEVar5 = local_98.children.fixed._M_elems + IVar4;
      }
      ppEVar1 = *pppEVar5;
      cVar2 = wasm::Type::isSubType((Type)(local_38->type).id,(Type)((*ppEVar1)->type).id);
      if (cVar2 == '\0') {
        bVar7 = false;
      }
      else {
        FindAll<wasm::Pop>::FindAll(&local_58,*ppEVar1);
        bVar7 = local_58.list.super__Vector_base<wasm::Pop_*,_std::allocator<wasm::Pop_*>_>._M_impl.
                super__Vector_impl_data._M_start ==
                local_58.list.super__Vector_base<wasm::Pop_*,_std::allocator<wasm::Pop_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
        if (local_58.list.super__Vector_base<wasm::Pop_*,_std::allocator<wasm::Pop_*>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_58.list.
                          super__Vector_base<wasm::Pop_*,_std::allocator<wasm::Pop_*>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_58.list.
                                super__Vector_base<wasm::Pop_*,_std::allocator<wasm::Pop_*>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_58.list.
                                super__Vector_base<wasm::Pop_*,_std::allocator<wasm::Pop_*>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
      }
      if (bVar7) {
        *ppEVar1 = local_38;
        break;
      }
      index = index + 1;
      bVar6 = (Index)local_40 != index;
    } while (bVar6);
  }
  if (local_98.children.flexible.
      super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.children.flexible.
                    super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_98.children.flexible.
                          super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.children.flexible.
                          super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar6;
}

Assistant:

static bool replaceChildWith(Expression* expr, Expression* with) {
  for (auto*& child : ChildIterator(expr)) {
    // To replace, we must have an appropriate type, and we cannot replace a
    // Pop under any circumstances.
    if (Type::isSubType(with->type, child->type) &&
        FindAll<Pop>(child).list.empty()) {
      child = with;
      return true;
    }
  }
  return false;
}